

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isAssignmentOperator(SyntaxKind kind)

{
  if ((((0x38 < kind - LogicalLeftShiftAssignmentExpression) ||
       ((0x108000080040005U >> ((ulong)(kind - LogicalLeftShiftAssignmentExpression) & 0x3f) & 1) ==
        0)) && ((AssignmentExpression < kind || ((0x100181040U >> ((ulong)kind & 0x3f) & 1) == 0))))
     && (((kind != DivideAssignmentExpression && (kind != SubtractAssignmentExpression)) &&
         (kind != XorAssignmentExpression)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAssignmentOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
            return true;
        default:
            return false;
    }
}